

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcLinkCodeWithModuleName(char *bytecode,char *moduleName)

{
  bool bVar1;
  int iVar2;
  uint extraout_EDX;
  OutputContext *output;
  undefined1 local_288 [8];
  OutputContext outputCtx;
  undefined1 local_40 [8];
  TraceScope traceScope;
  char *moduleName_local;
  char *bytecode_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    bytecode_local._7_1_ = '\0';
  }
  else {
    if ((nullcLinkCodeWithModuleName::token == '\0') &&
       (iVar2 = __cxa_guard_acquire(&nullcLinkCodeWithModuleName::token), iVar2 != 0)) {
      nullcLinkCodeWithModuleName::token = NULLC::TraceGetToken("nullc","nullcLinkCode");
      __cxa_guard_release(&nullcLinkCodeWithModuleName::token);
    }
    NULLC::TraceScope::TraceScope((TraceScope *)local_40,nullcLinkCodeWithModuleName::token);
    bVar1 = Linker::LinkCode(NULLC::linker,bytecode,moduleName,true);
    if (bVar1) {
      NULLC::nullcLastError = Linker::GetLinkError(NULLC::linker);
      OutputContext::OutputContext((OutputContext *)local_288);
      outputCtx.stream = NULLC::openStream;
      outputCtx.openStream = (_func_void_ptr_char_ptr *)NULLC::writeStream;
      outputCtx.writeStream = (_func_void_void_ptr_char_ptr_uint *)NULLC::closeStream;
      outputCtx.outputBufDef[0xf8] = (char)NULLC::outputBuf;
      outputCtx.outputBufDef[0xf9] = NULLC::outputBuf._1_1_;
      outputCtx.outputBufDef[0xfa] = NULLC::outputBuf._2_1_;
      outputCtx.outputBufDef[0xfb] = NULLC::outputBuf._3_1_;
      outputCtx.outputBufDef[0xfc] = NULLC::outputBuf._4_1_;
      outputCtx.outputBufDef[0xfd] = NULLC::outputBuf._5_1_;
      outputCtx.outputBufDef[0xfe] = NULLC::outputBuf._6_1_;
      outputCtx.outputBufDef[0xff] = NULLC::outputBuf._7_1_;
      outputCtx.outputBuf._0_4_ = 0x2000;
      outputCtx.tempBufDef[0xf8] = (char)NULLC::tempOutputBuf;
      outputCtx.tempBufDef[0xf9] = NULLC::tempOutputBuf._1_1_;
      outputCtx.tempBufDef[0xfa] = NULLC::tempOutputBuf._2_1_;
      outputCtx.tempBufDef[0xfb] = NULLC::tempOutputBuf._3_1_;
      outputCtx.tempBufDef[0xfc] = NULLC::tempOutputBuf._4_1_;
      outputCtx.tempBufDef[0xfd] = NULLC::tempOutputBuf._5_1_;
      outputCtx.tempBufDef[0xfe] = NULLC::tempOutputBuf._6_1_;
      outputCtx.tempBufDef[0xff] = NULLC::tempOutputBuf._7_1_;
      outputCtx.tempBuf._0_4_ = 0x4000;
      if (((NULLC::enableLogFiles & 1) != 0) &&
         (outputCtx._536_8_ = (*(code *)NULLC::openStream)("link_reg_vm.txt"),
         outputCtx._536_8_ != 0)) {
        output = (OutputContext *)local_288;
        Linker::SaveRegVmListing(NULLC::linker,output,false);
        (*outputCtx.writeStream)((void *)outputCtx._536_8_,output->outputBufDef,extraout_EDX);
        outputCtx.tempBufSize = 0;
        outputCtx._540_4_ = 0;
      }
      if ((NULLC::currExec != 1) ||
         (bVar1 = ExecutorX86::TranslateToNative
                            (NULLC::executorX86,(bool)(NULLC::enableLogFiles & 1),
                             (OutputContext *)local_288), bVar1)) {
        if (NULLC::currExec == 2) {
          NULLC::nullcLastError = "LLVM JIT isn\'t available";
          bytecode_local._7_1_ = '\0';
        }
        else {
          if (NULLC::currExec == 0) {
            ExecutorRegVm::UpdateInstructionPointer(NULLC::executorRegVm);
          }
          if ((NULLC::enableExternalDebugger & 1) != 0) {
            Linker::CollectDebugInfo(NULLC::linker,&NULLC::executorX86->instAddress);
          }
          bytecode_local._7_1_ = '\x01';
        }
      }
      else {
        NULLC::nullcLastError = ExecutorX86::GetErrorMessage(NULLC::executorX86);
        bytecode_local._7_1_ = '\0';
      }
      outputCtx.closeStream._4_4_ = 1;
      OutputContext::~OutputContext((OutputContext *)local_288);
    }
    else {
      NULLC::nullcLastError = Linker::GetLinkError(NULLC::linker);
      bytecode_local._7_1_ = '\0';
      outputCtx.closeStream._4_4_ = 1;
    }
    NULLC::TraceScope::~TraceScope((TraceScope *)local_40);
  }
  return bytecode_local._7_1_;
}

Assistant:

nullres nullcLinkCodeWithModuleName(const char *bytecode, const char *moduleName)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcLinkCode");

#ifndef NULLC_NO_EXECUTOR
	if(!linker->LinkCode(bytecode, moduleName, true))
	{
		nullcLastError = linker->GetLinkError();
		return false;
	}

	nullcLastError = linker->GetLinkError();

	OutputContext outputCtx;

	outputCtx.openStream = openStream;
	outputCtx.writeStream = writeStream;
	outputCtx.closeStream = closeStream;

	outputCtx.outputBuf = outputBuf;
	outputCtx.outputBufSize = NULLC_OUTPUT_BUFFER_SIZE;

	outputCtx.tempBuf = tempOutputBuf;
	outputCtx.tempBufSize = NULLC_TEMP_OUTPUT_BUFFER_SIZE;

	if(enableLogFiles)
	{
		outputCtx.stream = outputCtx.openStream("link_reg_vm.txt");

		if(outputCtx.stream)
		{
			linker->SaveRegVmListing(outputCtx, false);

			outputCtx.closeStream(outputCtx.stream);
			outputCtx.stream = NULL;
		}
	}
#else
	(void)bytecode;
	(void)moduleName;

	nullcLastError = "No executor available, compile library without NULLC_NO_EXECUTOR";
#endif

	if(currExec == NULLC_X86)
	{
#ifdef NULLC_BUILD_X86_JIT
		if(!executorX86->TranslateToNative(enableLogFiles, outputCtx))
		{
			nullcLastError = executorX86->GetErrorMessage();
			return false;
		}
#else
		nullcLastError = "X86 JIT isn't available";
		return false;
#endif
	}

	if(currExec == NULLC_LLVM)
	{
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
		if(!executorLLVM->TranslateToNative())
		{
			nullcLastError = executorLLVM->GetErrorMessage();
			return false;
		}
#else
		nullcLastError = "LLVM JIT isn't available";
		return false;
#endif
	}

#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		executorRegVm->UpdateInstructionPointer();

#ifdef NULLC_BUILD_X86_JIT
	if(enableExternalDebugger)
		linker->CollectDebugInfo(&executorX86->instAddress);
#else
	if(enableExternalDebugger)
		linker->CollectDebugInfo(NULL);
#endif

#endif

#ifndef NULLC_NO_EXECUTOR
	return true;
#else
	return false;
#endif
}